

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_parse.c
# Opt level: O0

ngx_int_t ngx_parse_time(ngx_str_t *line,ngx_uint_t is_sec)

{
  u_char uVar1;
  bool bVar2;
  u_char *puVar3;
  u_char *puVar4;
  bool bVar5;
  uint local_6c;
  anon_enum_32 step;
  ngx_uint_t valid;
  ngx_int_t cutlim;
  ngx_int_t cutoff;
  ngx_int_t max;
  ngx_int_t scale;
  ngx_int_t total;
  ngx_int_t value;
  u_char *last;
  u_char *p;
  ngx_uint_t is_sec_local;
  ngx_str_t *line_local;
  
  bVar2 = false;
  total = 0;
  scale = 0;
  local_6c = 2;
  if (is_sec != 0) {
    local_6c = 0;
  }
  puVar3 = line->data + line->len;
  last = line->data;
  do {
    while( true ) {
      if (puVar3 <= last) {
        if (bVar2) {
          if (is_sec == 0) {
            if (0x20c49ba5e353f7 < total) {
              return -1;
            }
            total = total * 1000;
          }
          if (0x7fffffffffffffff - total < scale) {
            line_local = (ngx_str_t *)0xffffffffffffffff;
          }
          else {
            line_local = (ngx_str_t *)(scale + total);
          }
        }
        else {
          line_local = (ngx_str_t *)0xffffffffffffffff;
        }
        return (ngx_int_t)line_local;
      }
      if ((*last < 0x30) || (0x39 < *last)) break;
      if ((0xccccccccccccccb < total) && ((0xccccccccccccccc < total || (7 < (int)(*last - 0x30)))))
      {
        return -1;
      }
      total = total * 10 + (long)(int)(*last - 0x30);
      bVar2 = true;
      last = last + 1;
    }
    puVar4 = last + 1;
    uVar1 = *last;
    if (uVar1 == ' ') {
      if (6 < local_6c) {
        return -1;
      }
      local_6c = 9;
      cutoff = 0x7fffffffffffffff;
      max = 1;
      last = puVar4;
    }
    else if (uVar1 == 'M') {
      if (1 < local_6c) {
        return -1;
      }
      local_6c = 2;
      cutoff = 0x33c812681e8;
      max = 0x278d00;
      last = puVar4;
    }
    else if (uVar1 == 'd') {
      if (3 < local_6c) {
        return -1;
      }
      local_6c = 4;
      cutoff = 0x611722833944;
      max = 0x15180;
      last = puVar4;
    }
    else if (uVar1 == 'h') {
      if (4 < local_6c) {
        return -1;
      }
      local_6c = 5;
      cutoff = 0x91a2b3c4d5e6f;
      max = 0xe10;
      last = puVar4;
    }
    else if (uVar1 == 'm') {
      if ((puVar4 < puVar3) && (*puVar4 == 's')) {
        if ((is_sec != 0) || (7 < local_6c)) {
          return -1;
        }
        local_6c = 8;
        cutoff = 0x7fffffffffffffff;
        max = 1;
        last = last + 2;
      }
      else {
        if (5 < local_6c) {
          return -1;
        }
        local_6c = 6;
        cutoff = 0x222222222222222;
        max = 0x3c;
        last = puVar4;
      }
    }
    else if (uVar1 == 's') {
      if (6 < local_6c) {
        return -1;
      }
      local_6c = 7;
      cutoff = 0x7fffffffffffffff;
      max = 1;
      last = puVar4;
    }
    else if (uVar1 == 'w') {
      if (2 < local_6c) {
        return -1;
      }
      local_6c = 3;
      cutoff = 0xddebbc99a77;
      max = 0x93a80;
      last = puVar4;
    }
    else {
      if (uVar1 != 'y') {
        return -1;
      }
      if (local_6c != 0) {
        return -1;
      }
      local_6c = 1;
      cutoff = 0x4418a47ae5;
      max = 0x1e13380;
      last = puVar4;
    }
    if ((local_6c != 8) && (is_sec == 0)) {
      max = max * 1000;
      cutoff = (ulong)cutoff / 1000;
    }
    if (cutoff < total) {
      return -1;
    }
    if (0x7fffffffffffffff - max * total < scale) {
      return -1;
    }
    scale = max * total + scale;
    total = 0;
    while( true ) {
      bVar5 = false;
      if (last < puVar3) {
        bVar5 = *last == ' ';
      }
      if (!bVar5) break;
      last = last + 1;
    }
  } while( true );
}

Assistant:

ngx_int_t
ngx_parse_time(ngx_str_t *line, ngx_uint_t is_sec)
{
    u_char      *p, *last;
    ngx_int_t    value, total, scale;
    ngx_int_t    max, cutoff, cutlim;
    ngx_uint_t   valid;
    enum {
        st_start = 0,
        st_year,
        st_month,
        st_week,
        st_day,
        st_hour,
        st_min,
        st_sec,
        st_msec,
        st_last
    } step;

    valid = 0;
    value = 0;
    total = 0;
    cutoff = NGX_MAX_INT_T_VALUE / 10;
    cutlim = NGX_MAX_INT_T_VALUE % 10;
    step = is_sec ? st_start : st_month;

    p = line->data;
    last = p + line->len;

    while (p < last) {

        if (*p >= '0' && *p <= '9') {
            if (value >= cutoff && (value > cutoff || *p - '0' > cutlim)) {
                return NGX_ERROR;
            }

            value = value * 10 + (*p++ - '0');
            valid = 1;
            continue;
        }

        switch (*p++) {

        case 'y':
            if (step > st_start) {
                return NGX_ERROR;
            }
            step = st_year;
            max = NGX_MAX_INT_T_VALUE / (60 * 60 * 24 * 365);
            scale = 60 * 60 * 24 * 365;
            break;

        case 'M':
            if (step >= st_month) {
                return NGX_ERROR;
            }
            step = st_month;
            max = NGX_MAX_INT_T_VALUE / (60 * 60 * 24 * 30);
            scale = 60 * 60 * 24 * 30;
            break;

        case 'w':
            if (step >= st_week) {
                return NGX_ERROR;
            }
            step = st_week;
            max = NGX_MAX_INT_T_VALUE / (60 * 60 * 24 * 7);
            scale = 60 * 60 * 24 * 7;
            break;

        case 'd':
            if (step >= st_day) {
                return NGX_ERROR;
            }
            step = st_day;
            max = NGX_MAX_INT_T_VALUE / (60 * 60 * 24);
            scale = 60 * 60 * 24;
            break;

        case 'h':
            if (step >= st_hour) {
                return NGX_ERROR;
            }
            step = st_hour;
            max = NGX_MAX_INT_T_VALUE / (60 * 60);
            scale = 60 * 60;
            break;

        case 'm':
            if (p < last && *p == 's') {
                if (is_sec || step >= st_msec) {
                    return NGX_ERROR;
                }
                p++;
                step = st_msec;
                max = NGX_MAX_INT_T_VALUE;
                scale = 1;
                break;
            }

            if (step >= st_min) {
                return NGX_ERROR;
            }
            step = st_min;
            max = NGX_MAX_INT_T_VALUE / 60;
            scale = 60;
            break;

        case 's':
            if (step >= st_sec) {
                return NGX_ERROR;
            }
            step = st_sec;
            max = NGX_MAX_INT_T_VALUE;
            scale = 1;
            break;

        case ' ':
            if (step >= st_sec) {
                return NGX_ERROR;
            }
            step = st_last;
            max = NGX_MAX_INT_T_VALUE;
            scale = 1;
            break;

        default:
            return NGX_ERROR;
        }

        if (step != st_msec && !is_sec) {
            scale *= 1000;
            max /= 1000;
        }

        if (value > max) {
            return NGX_ERROR;
        }

        value *= scale;

        if (total > NGX_MAX_INT_T_VALUE - value) {
            return NGX_ERROR;
        }

        total += value;

        value = 0;

        while (p < last && *p == ' ') {
            p++;
        }
    }

    if (!valid) {
        return NGX_ERROR;
    }

    if (!is_sec) {
        if (value > NGX_MAX_INT_T_VALUE / 1000) {
            return NGX_ERROR;
        }

        value *= 1000;
    }

    if (total > NGX_MAX_INT_T_VALUE - value) {
        return NGX_ERROR;
    }

    return total + value;
}